

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O3

void __thiscall agg::trans_single_path::finalize_path(trans_single_path *this)

{
  vertex_dist **ppvVar1;
  vertex_dist *pvVar2;
  vertex_dist *pvVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  if (this->m_status != making_path) {
    return;
  }
  if ((this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size < 2) {
    return;
  }
  vertex_sequence<agg::vertex_dist,_6U>::close(&this->m_src_vertices,0);
  uVar5 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
  if (uVar5 < 3) {
LAB_00118f66:
    if (uVar5 == 0) {
      dVar8 = INFINITY;
      goto LAB_00118fb8;
    }
  }
  else {
    ppvVar1 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
    uVar6 = uVar5 - 2 & 0x3f;
    dVar8 = ppvVar1[uVar5 - 2 >> 6][uVar6].dist;
    dVar7 = ppvVar1[uVar5 - 3 >> 6][uVar5 - 3 & 0x3f].dist;
    if (dVar8 * 10.0 < dVar7) {
      pvVar3 = ppvVar1[uVar5 - 2 >> 6] + uVar6;
      pvVar2 = ppvVar1[uVar5 - 1 >> 6];
      uVar5 = uVar5 - 1 & 0x3f;
      pvVar3->dist = pvVar2[uVar5].dist;
      pvVar2 = pvVar2 + uVar5;
      dVar4 = pvVar2->y;
      pvVar3->x = pvVar2->x;
      pvVar3->y = dVar4;
      uVar5 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = uVar5 - 1;
        (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size = uVar5;
      }
      (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks[uVar5 - 2 >> 6]
      [uVar5 - 2 & 0x3f].dist = dVar8 + dVar7;
      goto LAB_00118f66;
    }
  }
  ppvVar1 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
  uVar6 = 0;
  dVar7 = 0.0;
  do {
    pvVar3 = ppvVar1[uVar6 >> 6];
    dVar8 = pvVar3[uVar6 & 0x3f].dist + dVar7;
    pvVar3[uVar6 & 0x3f].dist = dVar7;
    uVar6 = uVar6 + 1;
    dVar7 = dVar8;
  } while (uVar5 != uVar6);
  dVar8 = (double)(uVar5 - 1) / dVar8;
LAB_00118fb8:
  this->m_kindex = dVar8;
  this->m_status = ready;
  return;
}

Assistant:

void trans_single_path::finalize_path()
    {
        if(m_status == making_path && m_src_vertices.size() > 1)
        {
            unsigned i;
            double dist;
            double d;

            m_src_vertices.close(false);
            if(m_src_vertices.size() > 2)
            {
                if(m_src_vertices[m_src_vertices.size() - 2].dist * 10.0 < 
                   m_src_vertices[m_src_vertices.size() - 3].dist)
                {
                    d = m_src_vertices[m_src_vertices.size() - 3].dist + 
                        m_src_vertices[m_src_vertices.size() - 2].dist;

                    m_src_vertices[m_src_vertices.size() - 2] = 
                        m_src_vertices[m_src_vertices.size() - 1];

                    m_src_vertices.remove_last();
                    m_src_vertices[m_src_vertices.size() - 2].dist = d;
                }
            }

            dist = 0.0;
            for(i = 0; i < m_src_vertices.size(); i++)
            {
                vertex_dist& v = m_src_vertices[i];
                double d = v.dist;
                v.dist = dist;
                dist += d;
            }
            m_kindex = (m_src_vertices.size() - 1) / dist;
            m_status = ready;
        }
    }